

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O3

void __thiscall
tcmalloc::ThreadCache::ReleaseToCentralCache(ThreadCache *this,FreeList *src,uint32_t cl,int N)

{
  int iVar1;
  uint uVar2;
  undefined8 ***pppuVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined8 ***pppuVar7;
  uint N_00;
  undefined8 **local_38;
  void *tail;
  
  if ((ulong)src->length_ < (ulong)(long)N) {
    N = src->length_;
  }
  uVar6 = (ulong)cl;
  iVar5 = (&DAT_0012d644)[uVar6];
  iVar1 = (&DAT_0012d844)[uVar6];
  N_00 = N;
  if (iVar5 < N) {
    do {
      if (iVar5 == 0) {
        pppuVar7 = (undefined8 ***)0x0;
        pppuVar3 = &local_38;
      }
      else {
        pppuVar7 = (undefined8 ***)src->list_;
        pppuVar3 = pppuVar7;
        iVar4 = iVar5 + -1;
        if (1 < iVar5) {
          do {
            pppuVar3 = (undefined8 ***)*pppuVar3;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        src->list_ = *pppuVar3;
        local_38 = pppuVar3;
      }
      *pppuVar3 = (undefined8 **)0x0;
      uVar2 = src->length_ - iVar5;
      src->length_ = uVar2;
      if (uVar2 < src->lowater_) {
        src->lowater_ = uVar2;
      }
      CentralFreeList::InsertRange
                ((CentralFreeList *)(&Static::central_cache_ + uVar6 * 0x130),pppuVar7,local_38,
                 iVar5);
      N_00 = N_00 - iVar5;
    } while (iVar5 < (int)N_00);
  }
  if (N_00 == 0) {
    pppuVar3 = &local_38;
    pppuVar7 = (undefined8 ***)0x0;
  }
  else {
    pppuVar7 = (undefined8 ***)src->list_;
    pppuVar3 = pppuVar7;
    if (1 < (int)N_00) {
      iVar5 = N_00 - 1;
      do {
        pppuVar3 = (undefined8 ***)*pppuVar3;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    src->list_ = *pppuVar3;
    local_38 = pppuVar3;
  }
  *pppuVar3 = (undefined8 **)0x0;
  uVar2 = src->length_ - N_00;
  src->length_ = uVar2;
  if (uVar2 < src->lowater_) {
    src->lowater_ = uVar2;
  }
  CentralFreeList::InsertRange
            ((CentralFreeList *)(&Static::central_cache_ + uVar6 * 0x130),pppuVar7,local_38,N_00);
  this->size_ = this->size_ - N * iVar1;
  return;
}

Assistant:

void ThreadCache::ReleaseToCentralCache(FreeList* src, uint32_t cl, int N) {
  ASSERT(src == &list_[cl]);
  if (N > src->length()) N = src->length();
  size_t delta_bytes = N * Static::sizemap()->ByteSizeForClass(cl);

  // We return prepackaged chains of the correct size to the central cache.
  // TODO: Use the same format internally in the thread caches?
  int batch_size = Static::sizemap()->num_objects_to_move(cl);
  while (N > batch_size) {
    void *tail, *head;
    src->PopRange(batch_size, &head, &tail);
    Static::central_cache()[cl].InsertRange(head, tail, batch_size);
    N -= batch_size;
  }
  void *tail, *head;
  src->PopRange(N, &head, &tail);
  Static::central_cache()[cl].InsertRange(head, tail, N);
  size_ -= delta_bytes;
}